

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_astArgumentNode_primitiveAnalyze
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  _Bool _Var1;
  sysbvm_tuple_t *psVar2;
  sysbvm_tuple_t sVar3;
  undefined1 local_a0 [8];
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_stackFrameGCRootsRecord_t gcFrameRecord;
  anon_struct_48_6_039ee114 gcFrame;
  sysbvm_tuple_t *environment;
  sysbvm_tuple_t *node;
  sysbvm_tuple_t *arguments_local;
  size_t argumentCount_local;
  sysbvm_tuple_t closure_local;
  sysbvm_context_t *context_local;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  psVar2 = arguments + 1;
  memset(&gcFrameRecord.roots,0,0x30);
  memset(&sourcePositionRecord.sourcePosition,0,0x20);
  gcFrameRecord.previous._0_4_ = 0;
  gcFrameRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_SOURCE_POSITION;
  gcFrameRecord._12_4_ = 0;
  gcFrameRecord.rootCount = (size_t)&gcFrameRecord.roots;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition);
  gcFrameRecord.roots = (sysbvm_tuple_t *)sysbvm_context_shallowCopy(context,*arguments);
  sVar3 = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken(context,*psVar2);
  gcFrameRecord.roots[3] = sVar3;
  local_a0 = (undefined1  [8])0x0;
  sourcePositionRecord.previous._0_4_ = 6;
  sourcePositionRecord._8_8_ = gcFrameRecord.roots[2];
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)local_a0);
  if (gcFrameRecord.roots[6] != 0) {
    sVar3 = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment
                      (context,gcFrameRecord.roots[6],(context->roots).symbolType,*psVar2);
    gcFrameRecord.roots[6] = sVar3;
    _Var1 = sysbvm_astNode_isLiteralNode(context,sVar3);
    if (_Var1) {
      gcFrame.analyzedType = sysbvm_astLiteralNode_getValue(sVar3);
    }
  }
  if (gcFrameRecord.roots[7] != 0) {
    sVar3 = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment
                      (context,gcFrameRecord.roots[7],(context->roots).typeType,*psVar2);
    gcFrameRecord.roots[7] = sVar3;
    _Var1 = sysbvm_astNode_isLiteralNode(context,sVar3);
    if (_Var1) {
      gcFrame.evaluatedName = sysbvm_astLiteralNode_getValue(sVar3);
    }
  }
  if (gcFrameRecord.roots[7] == 0) {
    sVar3 = sysbvm_astLiteralNode_create
                      (context,gcFrameRecord.roots[2],(context->roots).anyValueType);
    gcFrameRecord.roots[7] = sVar3;
  }
  if (gcFrame.evaluatedName == 0) {
    gcFrame.evaluatedName = (context->roots).anyValueType;
  }
  gcFrameRecord.roots[4] = gcFrame.evaluatedName;
  sVar3 = sysbvm_analysisEnvironment_setNewSymbolArgumentBinding
                    (context,*psVar2,gcFrameRecord.roots[2],gcFrame.analyzedType,
                     gcFrame.evaluatedName);
  gcFrameRecord.roots[8] = sVar3;
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)local_a0);
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition);
  return (sysbvm_tuple_t)gcFrameRecord.roots;
}

Assistant:

static sysbvm_tuple_t sysbvm_astArgumentNode_primitiveAnalyze(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    struct {
        sysbvm_astArgumentNode_t *argumentNode;
        sysbvm_tuple_t analyzedName;
        sysbvm_tuple_t analyzedType;
        sysbvm_tuple_t evaluatedName;
        sysbvm_tuple_t evaluatedType;
        sysbvm_tuple_t argumentBinding;

    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    gcFrame.argumentNode = (sysbvm_astArgumentNode_t*)sysbvm_context_shallowCopy(context, *node);
    gcFrame.argumentNode->super.analyzerToken = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken(context, *environment);

    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, gcFrame.argumentNode->super.sourcePosition);

    if(gcFrame.argumentNode->name)
    {
        gcFrame.analyzedName = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment(context, gcFrame.argumentNode->name, context->roots.symbolType, *environment);
        gcFrame.argumentNode->name = gcFrame.analyzedName;

        if(sysbvm_astNode_isLiteralNode(context, gcFrame.analyzedName))
            gcFrame.evaluatedName = sysbvm_astLiteralNode_getValue(gcFrame.analyzedName);
    }
    if(gcFrame.argumentNode->type)
    {
        gcFrame.analyzedType = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment(context, gcFrame.argumentNode->type, context->roots.typeType, *environment);
        gcFrame.argumentNode->type = gcFrame.analyzedType;
        if(sysbvm_astNode_isLiteralNode(context, gcFrame.analyzedType))
            gcFrame.evaluatedType = sysbvm_astLiteralNode_getValue(gcFrame.analyzedType);
    }

    // TODO: Fetch or attempt to infer the default argument type from a more proper place.
    if(!gcFrame.argumentNode->type)
        gcFrame.argumentNode->type = sysbvm_astLiteralNode_create(context, gcFrame.argumentNode->super.sourcePosition, context->roots.anyValueType);
    if(!gcFrame.evaluatedType)
        gcFrame.evaluatedType = context->roots.anyValueType;
    gcFrame.argumentNode->super.analyzedType = gcFrame.evaluatedType;

    gcFrame.argumentBinding = sysbvm_analysisEnvironment_setNewSymbolArgumentBinding(context, *environment, gcFrame.argumentNode->super.sourcePosition, gcFrame.evaluatedName, gcFrame.evaluatedType);
    gcFrame.argumentNode->binding = gcFrame.argumentBinding;

    SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return (sysbvm_tuple_t)gcFrame.argumentNode;
}